

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::SearchWithAnchoring<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is,bool anchorBegin,bool anchorEnd)

{
  SizeType *pSVar1;
  uint uVar2;
  long lVar3;
  uint codepoint;
  size_t __n;
  Stack<rapidjson::CrtAllocator> *pSVar4;
  bool bVar5;
  bool bVar6;
  Stack<rapidjson::CrtAllocator> *pSVar7;
  long lVar8;
  ulong __n_00;
  uint *puVar9;
  Stack<rapidjson::CrtAllocator> *l;
  DecodedStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_rapidjson::UTF8<char>_> ds;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *local_68;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *local_60;
  uint local_48 [2];
  size_t local_40;
  GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *local_38;
  
  local_48[0] = 0;
  bVar5 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,local_48);
  if (!bVar5) {
    local_48[0] = 0;
  }
  *(undefined8 *)(this + 0x30) = *(undefined8 *)(this + 0x28);
  __n_00 = (ulong)(*(int *)(*(long *)this + 0x74) + 0x1fU >> 3 & 0xfffffffc);
  memset(*(void **)(this + 0x78),0,__n_00);
  bVar5 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this,(Stack<rapidjson::CrtAllocator> *)(this + 0x18),
                     *(SizeType *)(*(long *)this + 0x70));
  if ((*(long *)(this + 0x30) != *(long *)(this + 0x28)) && (local_48[0] != 0)) {
    local_68 = this + 0x28;
    local_60 = this + 0x30;
    pSVar4 = (Stack<rapidjson::CrtAllocator> *)(this + 0x18);
    l = (Stack<rapidjson::CrtAllocator> *)(this + 0x48);
    local_40 = __n_00;
    while( true ) {
      pSVar7 = pSVar4;
      __n = local_40;
      codepoint = local_48[0];
      bVar5 = UTF8<char>::Decode<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is,local_48)
      ;
      if (!bVar5) {
        local_48[0] = 0;
      }
      bVar5 = false;
      memset(*(void **)(this + 0x78),0,__n);
      l->stackTop_ = l->stack_;
      puVar9 = *(uint **)local_68;
      if (puVar9 == *(uint **)local_60) break;
      local_68 = (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                  *)&l->stack_;
      local_38 = (GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                  *)&l->stackTop_;
      bVar5 = false;
      do {
        if (*(uint *)(*(long *)this + 0x74) <= *puVar9) {
          __assert_fail("index < stateCount_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                        ,0xaf,
                        "const State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                       );
        }
        lVar3 = *(long *)(*(long *)this + 0x20);
        lVar8 = (ulong)*puVar9 * 0x10;
        pSVar1 = (SizeType *)(lVar3 + lVar8);
        uVar2 = *(uint *)(lVar3 + 0xc + lVar8);
        if ((uVar2 == 0xffffffff || uVar2 == codepoint) ||
           ((uVar2 == 0xfffffffe &&
            (bVar6 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::MatchRange((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                                   *)this,pSVar1[2],codepoint), bVar6)))) {
          bVar6 = GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                              *)this,l,*pSVar1);
          bVar5 = (bool)(bVar6 | bVar5);
          if ((!anchorEnd) && (bVar5 != false)) {
            return true;
          }
        }
        if (!anchorBegin) {
          GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::AddState((GenericRegexSearch<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this,l,*(SizeType *)(*(long *)this + 0x70));
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != *(uint **)local_60);
      if (*(char **)local_38 == *(char **)local_68) {
        return bVar5;
      }
      local_60 = local_38;
      pSVar4 = l;
      l = pSVar7;
      if (local_48[0] == 0) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool SearchWithAnchoring(InputStream& is, bool anchorBegin, bool anchorEnd) {
        DecodedStream<InputStream, Encoding> ds(is);

        state0_.Clear();
        Stack<Allocator> *current = &state0_, *next = &state1_;
        const size_t stateSetSize = GetStateSetSize();
        std::memset(stateSet_, 0, stateSetSize);

        bool matched = AddState(*current, regex_.root_);
        unsigned codepoint;
        while (!current->Empty() && (codepoint = ds.Take()) != 0) {
            std::memset(stateSet_, 0, stateSetSize);
            next->Clear();
            matched = false;
            for (const SizeType* s = current->template Bottom<SizeType>(); s != current->template End<SizeType>(); ++s) {
                const State& sr = regex_.GetState(*s);
                if (sr.codepoint == codepoint ||
                    sr.codepoint == RegexType::kAnyCharacterClass || 
                    (sr.codepoint == RegexType::kRangeCharacterClass && MatchRange(sr.rangeStart, codepoint)))
                {
                    matched = AddState(*next, sr.out) || matched;
                    if (!anchorEnd && matched)
                        return true;
                }
                if (!anchorBegin)
                    AddState(*next, regex_.root_);
            }
            internal::Swap(current, next);
        }

        return matched;
    }